

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

void __thiscall calculator::ExpressionParser<__int128>::unexpected(ExpressionParser<__int128> *this)

{
  ostream *poVar1;
  error *this_00;
  ostringstream msg;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Syntax error: unexpected token \"",0x20);
  std::__cxx11::string::substr((ulong)&local_1b8,(ulong)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" at index ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  error::error(this_00,&this->expr_,&local_1b8);
  __cxa_throw(this_00,&error::typeinfo,error::~error);
}

Assistant:

void unexpected() const
  {
    std::ostringstream msg;
    msg << "Syntax error: unexpected token \""
        << expr_.substr(index_, expr_.size() - index_)
        << "\" at index "
        << index_;
    throw calculator::error(expr_, msg.str());
  }